

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O1

string * prepareEvalExpr(string *__return_storage_ptr__,string *eval)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  pointer pcVar6;
  pointer pcVar7;
  long lVar8;
  long lVar9;
  string newString;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  sVar2 = eval->_M_string_length;
  if (sVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = (eval->_M_dataplus)._M_p;
    pcVar7 = pcVar6;
  }
  else {
    uVar4 = (int)sVar2 - 1;
    if (-1 < (int)uVar4) {
      pcVar7 = (eval->_M_dataplus)._M_p;
      lVar8 = (ulong)uVar4 + 1;
      do {
        cVar1 = pcVar7[lVar8 + -1];
        if (('\0' < cVar1) && (iVar5 = isalnum((int)cVar1), cVar1 == ':' && iVar5 == 0)) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar7,pcVar7 + sVar2);
          local_50[0][lVar8 + -1] = 0x2e;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar7 = (eval->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar7,pcVar7 + eval->_M_string_length);
          if (local_50[0] == local_40) {
            return __return_storage_ptr__;
          }
          operator_delete(local_50[0]);
          return __return_storage_ptr__;
        }
        lVar9 = lVar8 + -1;
        bVar3 = 0 < lVar8;
        lVar8 = lVar9;
      } while (lVar9 != 0 && bVar3);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = (eval->_M_dataplus)._M_p;
    pcVar6 = pcVar7 + eval->_M_string_length;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string prepareEvalExpr(const std::string& eval)
{
	if (eval.empty())
	{
		return eval;
	}

	int lastIndex = static_cast<int>(eval.size() - 1);

	for (int i = lastIndex; i >= 0; i--)
	{
		auto ch = eval[i];
		if (ch > 0)
		{
			if (!isalnum(ch) && ch != '_')
			{
				if (ch == ':')
				{
					auto newString = eval;
					newString[i] = '.';
					return eval;
				}
			}
		}
	}
	return eval;
}